

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fraMan.c
# Opt level: O1

Aig_Man_t * Fra_ManPrepareComb(Fra_Man_t *p)

{
  int iVar1;
  Aig_Man_t *pAVar2;
  char *pcVar3;
  void *pvVar4;
  long lVar5;
  Aig_Man_t *p_00;
  size_t sVar6;
  char *pcVar7;
  Vec_Ptr_t *pVVar8;
  Aig_Obj_t *pAVar9;
  Vec_Ptr_t **__s;
  int *__s_00;
  long lVar10;
  
  if (p->pManFraig != (Aig_Man_t *)0x0) {
    __assert_fail("p->pManFraig == NULL",
                  "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraMan.c"
                  ,0xb5,"Aig_Man_t *Fra_ManPrepareComb(Fra_Man_t *)");
  }
  p_00 = Aig_ManStart(p->pManAig->vObjs->nSize);
  pAVar2 = p->pManAig;
  pcVar3 = pAVar2->pName;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pName = pcVar7;
  pcVar3 = pAVar2->pSpec;
  if (pcVar3 == (char *)0x0) {
    pcVar7 = (char *)0x0;
  }
  else {
    sVar6 = strlen(pcVar3);
    pcVar7 = (char *)malloc(sVar6 + 1);
    strcpy(pcVar7,pcVar3);
  }
  p_00->pSpec = pcVar7;
  p_00->nRegs = pAVar2->nRegs;
  p_00->nAsserts = pAVar2->nAsserts;
  pvVar4 = (pAVar2->pConst1->field_5).pData;
  *(Aig_Obj_t **)
   (*(long *)((long)pvVar4 + 0x20) +
   (long)pAVar2->pConst1->Id * (long)*(int *)((long)pvVar4 + 0x18) * 8) = p_00->pConst1;
  pVVar8 = p->pManAig->vCis;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      pvVar4 = pVVar8->pArray[lVar10];
      pAVar9 = Aig_ObjCreateCi(p_00);
      lVar5 = *(long *)((long)pvVar4 + 0x28);
      *(Aig_Obj_t **)
       (*(long *)(lVar5 + 0x20) +
       (long)*(int *)((long)pvVar4 + 0x24) * (long)*(int *)(lVar5 + 0x18) * 8) = pAVar9;
      lVar10 = lVar10 + 1;
      pVVar8 = p->pManAig->vCis;
    } while (lVar10 < pVVar8->nSize);
  }
  pVVar8 = p_00->vObjs;
  if (0 < pVVar8->nSize) {
    lVar10 = 0;
    do {
      if (pVVar8->pArray[lVar10] != (void *)0x0) {
        *(Fra_Man_t **)((long)pVVar8->pArray[lVar10] + 0x28) = p;
      }
      lVar10 = lVar10 + 1;
      pVVar8 = p_00->vObjs;
    } while (lVar10 < pVVar8->nSize);
  }
  iVar1 = p->nSizeAlloc;
  p->nMemAlloc = iVar1;
  sVar6 = (long)iVar1 * 8;
  __s = (Vec_Ptr_t **)malloc(sVar6);
  p->pMemFanins = __s;
  memset(__s,0,sVar6);
  sVar6 = (long)iVar1 << 2;
  __s_00 = (int *)malloc(sVar6);
  p->pMemSatNums = __s_00;
  memset(__s_00,0,sVar6);
  if (p_00->pData == (void *)0x0) {
    return p_00;
  }
  __assert_fail("pManFraig->pData == NULL",
                "/workspace/llm4binary/github/license_c_cmakelists/topjohnwu[P]CAD-Contest-NP3/src/proof/fra/fraMan.c"
                ,0xca,"Aig_Man_t *Fra_ManPrepareComb(Fra_Man_t *)");
}

Assistant:

Aig_Man_t * Fra_ManPrepareComb( Fra_Man_t * p )
{
    Aig_Man_t * pManFraig;
    Aig_Obj_t * pObj;
    int i;
    assert( p->pManFraig == NULL );
    // start the fraig package
    pManFraig = Aig_ManStart( Aig_ManObjNumMax(p->pManAig) );
    pManFraig->pName = Abc_UtilStrsav( p->pManAig->pName );
    pManFraig->pSpec = Abc_UtilStrsav( p->pManAig->pSpec );
    pManFraig->nRegs    = p->pManAig->nRegs;
    pManFraig->nAsserts = p->pManAig->nAsserts;
    // set the pointers to the available fraig nodes
    Fra_ObjSetFraig( Aig_ManConst1(p->pManAig), 0, Aig_ManConst1(pManFraig) );
    Aig_ManForEachCi( p->pManAig, pObj, i )
        Fra_ObjSetFraig( pObj, 0, Aig_ObjCreateCi(pManFraig) );
    // set the pointers to the manager
    Aig_ManForEachObj( pManFraig, pObj, i )
        pObj->pData = p;
    // allocate memory for mapping FRAIG nodes into SAT numbers and fanins
    p->nMemAlloc = p->nSizeAlloc;
    p->pMemFanins = ABC_ALLOC( Vec_Ptr_t *, p->nMemAlloc );
    memset( p->pMemFanins, 0, sizeof(Vec_Ptr_t *) * p->nMemAlloc );
    p->pMemSatNums = ABC_ALLOC( int, p->nMemAlloc );
    memset( p->pMemSatNums, 0, sizeof(int) * p->nMemAlloc );
    // make sure the satisfying assignment is node assigned
    assert( pManFraig->pData == NULL );
    return pManFraig;
}